

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferTextureBufferRange::logError
          (TextureBufferTextureBufferRange *this,char *phase,char *internalFormat,GLuint component,
          char *exptectedValue,char *resultValue)

{
  ostringstream *this_00;
  undefined1 local_1b0 [384];
  
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Result is different for ");
  std::operator<<((ostream *)this_00,phase);
  std::operator<<((ostream *)this_00," phase \n");
  std::operator<<((ostream *)this_00,"Internal Format: ");
  std::operator<<((ostream *)this_00,internalFormat);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Component Position: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Expected value: ");
  std::operator<<((ostream *)this_00,exptectedValue);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Result value: ");
  std::operator<<((ostream *)this_00,resultValue);
  std::operator<<((ostream *)this_00,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  return;
}

Assistant:

void TextureBufferTextureBufferRange::logError(const char* phase, const char* internalFormat, glw::GLuint component,
											   const char* exptectedValue, const char* resultValue)
{
	m_testCtx.getLog() << tcu::TestLog::Message << "Result is different for " << phase << " phase \n"
					   << "Internal Format: " << internalFormat << "\n"
					   << "Component Position: " << component << "\n"
					   << "Expected value: " << exptectedValue << "\n"
					   << "Result value: " << resultValue << "\n"
					   << tcu::TestLog::EndMessage;
}